

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  Configuration CVar1;
  clock_t cVar2;
  clock_t cVar3;
  ostream *this;
  clock_t requestEndTime;
  SquareSolverService service;
  PolynomeReader<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_3U>
  reader;
  clock_t requestStartTime;
  Configuration config;
  int argc_offset;
  SquareSolverService *in_stack_ffffffffffffff10;
  PolynomeReader<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_3U>
  *in_stack_ffffffffffffff18;
  SquareSolverService *in_stack_ffffffffffffff20;
  SquareSolverService *in_stack_ffffffffffffff30;
  int *in_stack_ffffffffffffff60;
  char **in_stack_ffffffffffffff68;
  int in_stack_ffffffffffffff70;
  
  std::ios_base::precision((ios_base *)((long)&std::cout + *(long *)(std::cout + -0x18)),100);
  CVar1 = ParseCmdArgs(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,in_stack_ffffffffffffff60
                      );
  cVar2 = clock();
  if (((uint)CVar1 & 0x1000000) == 0) {
    PolynomeReader<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_3U>
    ::PolynomeReader((PolynomeReader<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_3U>
                      *)in_stack_ffffffffffffff20,(int)((ulong)in_stack_ffffffffffffff18 >> 0x20),
                     (char **)in_stack_ffffffffffffff10);
  }
  else {
    PolynomeReader<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_3U>
    ::PolynomeReader((PolynomeReader<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_3U>
                      *)in_stack_ffffffffffffff20,(istream *)in_stack_ffffffffffffff18);
  }
  SquareSolverService::SquareSolverService
            (in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,
             SUB81((ulong)in_stack_ffffffffffffff10 >> 0x38,0),(int)in_stack_ffffffffffffff10);
  SquareSolverService::Run(in_stack_ffffffffffffff30);
  cVar3 = clock();
  if (((uint)CVar1 & 0x10000) != 0) {
    std::ios_base::precision((ios_base *)((long)&std::cout + *(long *)(std::cout + -0x18)),6);
    this = std::operator<<((ostream *)&std::cout,"request processing time: ");
    in_stack_ffffffffffffff10 =
         (SquareSolverService *)std::ostream::operator<<(this,(double)(cVar3 - cVar2) / 1000000.0);
    std::ostream::operator<<(in_stack_ffffffffffffff10,std::endl<char,std::char_traits<char>>);
  }
  SquareSolverService::~SquareSolverService(in_stack_ffffffffffffff10);
  PolynomeReader<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_3U>
  ::~PolynomeReader((PolynomeReader<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_3U>
                     *)0x1064f5);
  return 0;
}

Assistant:

int main(int argc, char **argv) {
    std::cout.precision(std::numeric_limits<FloatType>::digits10);
    
    //argc_offset is used to make clear from which point of arguments interesting data is placed
    int argc_offset;
    const Configuration config = ParseCmdArgs(argc, argv, argc_offset);
    
    clock_t requestStartTime = clock();
    
    //interactive mode allows to type coeffs in console in real time
    PolynomeReader<FloatType, 3> reader = config.interactive ? PolynomeReader<FloatType, 3>(std::cin) : PolynomeReader<FloatType, 3>(argc - argc_offset, argv + argc_offset);
    SquareSolverService service(reader, config.silent, config.interactive ? 1 : 32);
    service.Run();
    
    clock_t requestEndTime = clock();

    if (config.measurePerformance) {
        std::cout.precision(6);
        std::cout << "request processing time: " << (requestEndTime - requestStartTime) / double(CLOCKS_PER_SEC) << std::endl;
    }
        
    return 0;
}